

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O1

void u_flushDefaultConverter_63(void)

{
  UConverter *pUVar1;
  UConverter *converter;
  
  if (gDefaultConverter == (UConverter *)0x0) {
    converter = (UConverter *)0x0;
  }
  else {
    umtx_lock_63((UMutex *)0x0);
    pUVar1 = gDefaultConverter;
    converter = (UConverter *)0x0;
    if (gDefaultConverter != (UConverter *)0x0) {
      gDefaultConverter = (UConverter *)0x0;
      converter = pUVar1;
    }
    umtx_unlock_63((UMutex *)0x0);
  }
  if (converter != (UConverter *)0x0) {
    ucnv_close_63(converter);
    return;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_flushDefaultConverter()
{
    UConverter *converter = NULL;
    
    if (gDefaultConverter != NULL) {
        umtx_lock(NULL);
        
        /* need to check to make sure it wasn't taken out from under us */
        if (gDefaultConverter != NULL) {
            converter = gDefaultConverter;
            gDefaultConverter = NULL;
        }
        umtx_unlock(NULL);
    }

    /* if the cache was populated, flush it */
    if(converter != NULL) {
         ucnv_close(converter);
    }
}